

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O1

void __thiscall
ParseNodeStr::ParseNodeStr(ParseNodeStr *this,charcount_t ichMin,charcount_t ichLim,IdentPtr name)

{
  (this->super_ParseNode).nop = knopStr;
  (this->super_ParseNode).grfpn = 0;
  (this->super_ParseNode).location = 0xffffffff;
  (this->super_ParseNode).field_0x1 = ((this->super_ParseNode).field_0x1 & 0xe0) + 1;
  (this->super_ParseNode).ichMin = ichMin;
  (this->super_ParseNode).ichLim = ichLim;
  this->pid = name;
  return;
}

Assistant:

ParseNodeStr::ParseNodeStr(charcount_t ichMin, charcount_t ichLim, IdentPtr name)
    : ParseNode(knopStr, ichMin, ichLim), pid(name)
{
}